

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reportjson.cpp
# Opt level: O0

void __thiscall trun::ResultsReportJSON::PrintAssertArray(ResultsReportJSON *this,Ref *result)

{
  bool bVar1;
  element_type *peVar2;
  AssertError *pAVar3;
  vector<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>
  *pvVar4;
  reference aerr;
  const_reference pvVar5;
  AssertErrorItem *ass;
  const_iterator __end1;
  const_iterator __begin1;
  vector<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>
  *__range1;
  Ref *result_local;
  ResultsReportJSON *this_local;
  
  ResultsReportPinterBase::WriteLine(&this->super_ResultsReportPinterBase,"\"Asserts\" : [");
  ResultsReportPinterBase::PushIndent(&this->super_ResultsReportPinterBase);
  peVar2 = std::__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)result);
  pAVar3 = TestResult::AssertError(peVar2);
  pvVar4 = AssertError::Errors(pAVar3);
  __end1 = std::
           vector<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>
           ::begin(pvVar4);
  ass = (AssertErrorItem *)
        std::
        vector<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>
        ::end(pvVar4);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_trun::AssertError::AssertErrorItem_*,_std::vector<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>_>
                      (&__end1,(__normal_iterator<const_trun::AssertError::AssertErrorItem_*,_std::vector<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>_>
                                *)&ass);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    aerr = __gnu_cxx::
           __normal_iterator<const_trun::AssertError::AssertErrorItem_*,_std::vector<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>_>
           ::operator*(&__end1);
    ResultsReportPinterBase::WriteLine(&this->super_ResultsReportPinterBase,"{");
    PrintAssert(this,aerr);
    peVar2 = std::__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)result);
    pAVar3 = TestResult::AssertError(peVar2);
    pvVar4 = AssertError::Errors(pAVar3);
    pvVar5 = std::
             vector<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>
             ::back(pvVar4);
    if (aerr == pvVar5) {
      ResultsReportPinterBase::WriteLine(&this->super_ResultsReportPinterBase,"}");
    }
    else {
      ResultsReportPinterBase::WriteLine(&this->super_ResultsReportPinterBase,"},");
    }
    __gnu_cxx::
    __normal_iterator<const_trun::AssertError::AssertErrorItem_*,_std::vector<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>_>
    ::operator++(&__end1);
  }
  ResultsReportPinterBase::PopIndent(&this->super_ResultsReportPinterBase);
  ResultsReportPinterBase::WriteLine(&this->super_ResultsReportPinterBase,"]");
  return;
}

Assistant:

void ResultsReportJSON::PrintAssertArray(const TestResult::Ref result) {
    WriteLine(R"("Asserts" : [)");
    PushIndent();
    for(const auto &ass : result->AssertError().Errors()) {
        WriteLine("{");
        PrintAssert(ass);
        // This must be the worst in a long while...
        if (&ass != &result->AssertError().Errors().back()) {
            WriteLine("},");
        } else {
            WriteLine("}");
        }
    }
    PopIndent();
    WriteLine("]");
}